

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_257,_false,_embree::sse2::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  char cVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  NodeRef *pNVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  undefined4 uVar24;
  ulong unaff_R15;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar45;
  vfloat4 a0;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  undefined1 auVar58 [12];
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  vfloat4 a;
  undefined1 auVar64 [16];
  float fVar65;
  float fVar66;
  float fVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar73;
  undefined1 auVar71 [16];
  float fVar74;
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  Precalculations pre;
  NodeRef stack [244];
  
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fVar66 = ray->tfar, 0.0 <= fVar66)) {
    fVar8 = (ray->dir).field_0.m128[0];
    fVar9 = (ray->dir).field_0.m128[1];
    fVar10 = (ray->dir).field_0.m128[2];
    fVar50 = (ray->dir).field_0.m128[3];
    fVar32 = fVar9 * fVar9;
    fVar33 = fVar10 * fVar10;
    fVar34 = fVar50 * fVar50;
    fVar45 = fVar32 + fVar8 * fVar8 + fVar33;
    auVar51._0_8_ = CONCAT44(fVar32 + fVar32 + fVar34,fVar45);
    auVar51._8_4_ = fVar32 + fVar33 + fVar33;
    auVar51._12_4_ = fVar32 + fVar34 + fVar34;
    auVar38._8_4_ = auVar51._8_4_;
    auVar38._0_8_ = auVar51._0_8_;
    auVar38._12_4_ = auVar51._12_4_;
    auVar51 = rsqrtss(auVar38,auVar51);
    fVar32 = auVar51._0_4_;
    pre.depth_scale = fVar32 * 1.5 - fVar32 * fVar32 * fVar45 * 0.5 * fVar32;
    fVar32 = fVar8 * pre.depth_scale;
    fVar33 = fVar9 * pre.depth_scale;
    fVar34 = fVar10 * pre.depth_scale;
    fVar61 = -fVar33;
    fVar45 = -fVar34;
    auVar58._8_4_ = 0xffffffff;
    auVar58._0_8_ = 0xffffffffffffffff;
    if (fVar61 * fVar61 + fVar34 * fVar34 + 0.0 <= fVar32 * fVar32 + fVar45 * fVar45 + 0.0) {
      auVar58 = SUB1612((undefined1  [16])0x0,0);
    }
    fVar55 = (float)((uint)fVar34 & auVar58._4_4_);
    fVar45 = (float)(~auVar58._0_4_ & (uint)fVar45);
    fVar57 = (float)(~auVar58._8_4_ & (uint)fVar32 | (uint)fVar61 & auVar58._8_4_);
    fVar61 = fVar55 * fVar55;
    fVar56 = fVar57 * fVar57;
    fVar62 = fVar61 + fVar45 * fVar45 + fVar56;
    fVar63 = fVar61 + fVar61 + 0.0;
    fVar56 = fVar61 + fVar56 + fVar56;
    fVar61 = fVar61 + 0.0 + 0.0;
    auVar64._4_4_ = fVar63;
    auVar64._0_4_ = fVar62;
    auVar64._8_4_ = fVar56;
    auVar64._12_4_ = fVar61;
    auVar42._4_4_ = fVar63;
    auVar42._0_4_ = fVar62;
    auVar42._8_4_ = fVar56;
    auVar42._12_4_ = fVar61;
    auVar51 = rsqrtss(auVar64,auVar42);
    fVar61 = auVar51._0_4_;
    fVar61 = fVar61 * 1.5 - fVar61 * fVar61 * fVar62 * 0.5 * fVar61;
    fVar45 = fVar61 * fVar45;
    fVar55 = fVar61 * fVar55;
    fVar57 = fVar61 * fVar57;
    fVar56 = fVar55 * fVar32 - fVar33 * fVar45;
    fVar62 = fVar57 * fVar33 - fVar34 * fVar55;
    fVar63 = fVar45 * fVar34 - fVar32 * fVar57;
    fVar60 = fVar61 * 0.0 * fVar50 * pre.depth_scale - fVar50 * pre.depth_scale * fVar61 * 0.0;
    fVar61 = fVar62 * fVar62;
    fVar59 = fVar63 * fVar63;
    fVar60 = fVar60 * fVar60;
    fVar65 = fVar59 + fVar61 + fVar56 * fVar56;
    fVar67 = fVar60 + fVar61 + fVar61;
    fVar59 = fVar59 + fVar61 + fVar59;
    fVar60 = fVar60 + fVar61 + fVar60;
    auVar54._4_4_ = fVar67;
    auVar54._0_4_ = fVar65;
    auVar54._8_4_ = fVar59;
    auVar54._12_4_ = fVar60;
    auVar49._4_4_ = fVar67;
    auVar49._0_4_ = fVar65;
    auVar49._8_4_ = fVar59;
    auVar49._12_4_ = fVar60;
    auVar51 = rsqrtss(auVar54,auVar49);
    fVar61 = auVar51._0_4_;
    fVar61 = fVar61 * 1.5 - fVar61 * fVar61 * fVar65 * 0.5 * fVar61;
    pre.ray_space.vx.field_0.m128[1] = fVar61 * fVar62;
    pre.ray_space.vx.field_0.m128[0] = fVar45;
    pre.ray_space.vx.field_0.m128[2] = pre.depth_scale * fVar32;
    pre.ray_space.vx.field_0.m128[3] = 0.0;
    pre.ray_space.vy.field_0.m128[1] = fVar61 * fVar63;
    pre.ray_space.vy.field_0.m128[0] = fVar55;
    pre.ray_space.vy.field_0.m128[2] = pre.depth_scale * fVar33;
    pre.ray_space.vy.field_0.m128[3] = 0.0;
    pre.ray_space.vz.field_0.m128[1] = fVar61 * fVar56;
    pre.ray_space.vz.field_0.m128[0] = fVar57;
    pre.ray_space.vz.field_0.m128[2] = pre.depth_scale * fVar34;
    pre.ray_space.vz.field_0.m128[3] = 0.0;
    pNVar20 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar33 = (ray->org).field_0.m128[0];
    fVar34 = (ray->org).field_0.m128[1];
    fVar45 = (ray->org).field_0.m128[2];
    fVar32 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar61 = 0.0;
    if (0.0 <= fVar32) {
      fVar61 = fVar32;
    }
    uVar25 = -(uint)((float)DAT_01ff1d40 <= ABS(fVar8));
    uVar26 = -(uint)(DAT_01ff1d40._4_4_ <= ABS(fVar9));
    uVar27 = -(uint)(DAT_01ff1d40._8_4_ <= ABS(fVar10));
    uVar28 = -(uint)(DAT_01ff1d40._12_4_ <= ABS(fVar50));
    auVar40._0_4_ = (uint)fVar8 & uVar25;
    auVar40._4_4_ = (uint)fVar9 & uVar26;
    auVar40._8_4_ = (uint)fVar10 & uVar27;
    auVar40._12_4_ = (uint)fVar50 & uVar28;
    auVar35._0_4_ = ~uVar25 & (uint)(float)DAT_01ff1d40;
    auVar35._4_4_ = ~uVar26 & (uint)DAT_01ff1d40._4_4_;
    auVar35._8_4_ = ~uVar27 & (uint)DAT_01ff1d40._8_4_;
    auVar35._12_4_ = ~uVar28 & (uint)DAT_01ff1d40._12_4_;
    auVar35 = auVar35 | auVar40;
    auVar51 = rcpps(auVar40,auVar35);
    fVar50 = auVar51._0_4_;
    fVar32 = auVar51._4_4_;
    fVar55 = auVar51._8_4_;
    fVar50 = (1.0 - auVar35._0_4_ * fVar50) * fVar50 + fVar50;
    fVar32 = (1.0 - auVar35._4_4_ * fVar32) * fVar32 + fVar32;
    fVar55 = (1.0 - auVar35._8_4_ * fVar55) * fVar55 + fVar55;
    uVar21 = (ulong)(fVar50 < 0.0) * 0x10;
    uVar22 = (ulong)(fVar32 < 0.0) << 4 | 0x20;
    uVar23 = (ulong)(fVar55 < 0.0) << 4 | 0x40;
    auVar68._4_4_ = fVar66;
    auVar68._0_4_ = fVar66;
    auVar68._8_4_ = fVar66;
    auVar68._12_4_ = fVar66;
    do {
      if (pNVar20 == stack) {
        return;
      }
      uVar16 = pNVar20[-1].ptr;
      pNVar20 = pNVar20 + -1;
      do {
        if ((uVar16 & 0xf) == 0) {
          pfVar1 = (float *)(uVar16 + 0x20 + uVar21);
          auVar29._0_4_ = (*pfVar1 - fVar33) * fVar50;
          auVar29._4_4_ = (pfVar1[1] - fVar33) * fVar50;
          auVar29._8_4_ = (pfVar1[2] - fVar33) * fVar50;
          auVar29._12_4_ = (pfVar1[3] - fVar33) * fVar50;
          pfVar1 = (float *)(uVar16 + 0x20 + uVar22);
          auVar36._0_4_ = (*pfVar1 - fVar34) * fVar32;
          auVar36._4_4_ = (pfVar1[1] - fVar34) * fVar32;
          auVar36._8_4_ = (pfVar1[2] - fVar34) * fVar32;
          auVar36._12_4_ = (pfVar1[3] - fVar34) * fVar32;
          auVar51 = maxps(auVar29,auVar36);
          pfVar1 = (float *)(uVar16 + 0x20 + uVar23);
          auVar37._0_4_ = (*pfVar1 - fVar45) * fVar55;
          auVar37._4_4_ = (pfVar1[1] - fVar45) * fVar55;
          auVar37._8_4_ = (pfVar1[2] - fVar45) * fVar55;
          auVar37._12_4_ = (pfVar1[3] - fVar45) * fVar55;
          pfVar1 = (float *)(uVar16 + 0x20 + (uVar21 ^ 0x10));
          auVar41._0_4_ = (*pfVar1 - fVar33) * fVar50;
          auVar41._4_4_ = (pfVar1[1] - fVar33) * fVar50;
          auVar41._8_4_ = (pfVar1[2] - fVar33) * fVar50;
          auVar41._12_4_ = (pfVar1[3] - fVar33) * fVar50;
          pfVar1 = (float *)(uVar16 + 0x20 + (uVar22 ^ 0x10));
          auVar46._0_4_ = (*pfVar1 - fVar34) * fVar32;
          auVar46._4_4_ = (pfVar1[1] - fVar34) * fVar32;
          auVar46._8_4_ = (pfVar1[2] - fVar34) * fVar32;
          auVar46._12_4_ = (pfVar1[3] - fVar34) * fVar32;
          auVar42 = minps(auVar41,auVar46);
          pfVar1 = (float *)(uVar16 + 0x20 + (uVar23 ^ 0x10));
          auVar47._0_4_ = (*pfVar1 - fVar45) * fVar55;
          auVar47._4_4_ = (pfVar1[1] - fVar45) * fVar55;
          auVar47._8_4_ = (pfVar1[2] - fVar45) * fVar55;
          auVar47._12_4_ = (pfVar1[3] - fVar45) * fVar55;
          auVar2._4_4_ = fVar61;
          auVar2._0_4_ = fVar61;
          auVar2._8_4_ = fVar61;
          auVar2._12_4_ = fVar61;
          auVar38 = maxps(auVar37,auVar2);
          auVar51 = maxps(auVar51,auVar38);
          auVar38 = minps(auVar47,auVar68);
          auVar38 = minps(auVar42,auVar38);
          auVar30._4_4_ = -(uint)(auVar51._4_4_ <= auVar38._4_4_);
          auVar30._0_4_ = -(uint)(auVar51._0_4_ <= auVar38._0_4_);
          auVar30._8_4_ = -(uint)(auVar51._8_4_ <= auVar38._8_4_);
          auVar30._12_4_ = -(uint)(auVar51._12_4_ <= auVar38._12_4_);
          uVar24 = movmskps((int)unaff_R15,auVar30);
LAB_00194332:
          unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar24);
          bVar12 = true;
        }
        else {
          if ((int)(uVar16 & 0xf) == 2) {
            uVar15 = uVar16 & 0xfffffffffffffff0;
            fVar67 = fVar8 * *(float *)(uVar15 + 0x20) +
                     fVar9 * *(float *)(uVar15 + 0x50) + fVar10 * *(float *)(uVar15 + 0x80);
            fVar76 = fVar8 * *(float *)(uVar15 + 0x24) +
                     fVar9 * *(float *)(uVar15 + 0x54) + fVar10 * *(float *)(uVar15 + 0x84);
            fVar77 = fVar8 * *(float *)(uVar15 + 0x28) +
                     fVar9 * *(float *)(uVar15 + 0x58) + fVar10 * *(float *)(uVar15 + 0x88);
            fVar78 = fVar8 * *(float *)(uVar15 + 0x2c) +
                     fVar9 * *(float *)(uVar15 + 0x5c) + fVar10 * *(float *)(uVar15 + 0x8c);
            fVar79 = fVar8 * *(float *)(uVar15 + 0x30) +
                     fVar9 * *(float *)(uVar15 + 0x60) + fVar10 * *(float *)(uVar15 + 0x90);
            fVar80 = fVar8 * *(float *)(uVar15 + 0x34) +
                     fVar9 * *(float *)(uVar15 + 100) + fVar10 * *(float *)(uVar15 + 0x94);
            fVar81 = fVar8 * *(float *)(uVar15 + 0x38) +
                     fVar9 * *(float *)(uVar15 + 0x68) + fVar10 * *(float *)(uVar15 + 0x98);
            fVar82 = fVar8 * *(float *)(uVar15 + 0x3c) +
                     fVar9 * *(float *)(uVar15 + 0x6c) + fVar10 * *(float *)(uVar15 + 0x9c);
            fVar66 = fVar8 * *(float *)(uVar15 + 0x40) +
                     fVar9 * *(float *)(uVar15 + 0x70) + fVar10 * *(float *)(uVar15 + 0xa0);
            fVar56 = fVar8 * *(float *)(uVar15 + 0x44) +
                     fVar9 * *(float *)(uVar15 + 0x74) + fVar10 * *(float *)(uVar15 + 0xa4);
            fVar57 = fVar8 * *(float *)(uVar15 + 0x48) +
                     fVar9 * *(float *)(uVar15 + 0x78) + fVar10 * *(float *)(uVar15 + 0xa8);
            fVar62 = fVar8 * *(float *)(uVar15 + 0x4c) +
                     fVar9 * *(float *)(uVar15 + 0x7c) + fVar10 * *(float *)(uVar15 + 0xac);
            fVar63 = (float)DAT_01ff1d40;
            fVar59 = DAT_01ff1d40._4_4_;
            fVar60 = DAT_01ff1d40._8_4_;
            fVar65 = DAT_01ff1d40._12_4_;
            uVar25 = -(uint)(fVar63 <= ABS(fVar67));
            uVar26 = -(uint)(fVar59 <= ABS(fVar76));
            uVar27 = -(uint)(fVar60 <= ABS(fVar77));
            uVar28 = -(uint)(fVar65 <= ABS(fVar78));
            auVar69._0_4_ = ~uVar25 & (uint)fVar63;
            auVar69._4_4_ = ~uVar26 & (uint)fVar59;
            auVar69._8_4_ = ~uVar27 & (uint)fVar60;
            auVar69._12_4_ = ~uVar28 & (uint)fVar65;
            auVar6._4_4_ = (uint)fVar76 & uVar26;
            auVar6._0_4_ = (uint)fVar67 & uVar25;
            auVar6._8_4_ = (uint)fVar77 & uVar27;
            auVar6._12_4_ = (uint)fVar78 & uVar28;
            auVar69 = auVar69 | auVar6;
            uVar25 = -(uint)(fVar63 <= ABS(fVar79));
            uVar26 = -(uint)(fVar59 <= ABS(fVar80));
            uVar27 = -(uint)(fVar60 <= ABS(fVar81));
            uVar28 = -(uint)(fVar65 <= ABS(fVar82));
            auVar71._0_4_ = ~uVar25 & (uint)fVar63;
            auVar71._4_4_ = ~uVar26 & (uint)fVar59;
            auVar71._8_4_ = ~uVar27 & (uint)fVar60;
            auVar71._12_4_ = ~uVar28 & (uint)fVar65;
            auVar7._4_4_ = (uint)fVar80 & uVar26;
            auVar7._0_4_ = (uint)fVar79 & uVar25;
            auVar7._8_4_ = (uint)fVar81 & uVar27;
            auVar7._12_4_ = (uint)fVar82 & uVar28;
            auVar71 = auVar71 | auVar7;
            uVar25 = -(uint)(fVar63 <= ABS(fVar66));
            uVar26 = -(uint)(fVar59 <= ABS(fVar56));
            uVar27 = -(uint)(fVar60 <= ABS(fVar57));
            uVar28 = -(uint)(fVar65 <= ABS(fVar62));
            auVar75._0_4_ = ~uVar25 & (uint)fVar63;
            auVar75._4_4_ = ~uVar26 & (uint)fVar59;
            auVar75._8_4_ = ~uVar27 & (uint)fVar60;
            auVar75._12_4_ = ~uVar28 & (uint)fVar65;
            auVar3._4_4_ = (uint)fVar56 & uVar26;
            auVar3._0_4_ = (uint)fVar66 & uVar25;
            auVar3._8_4_ = (uint)fVar57 & uVar27;
            auVar3._12_4_ = (uint)fVar62 & uVar28;
            auVar75 = auVar75 | auVar3;
            auVar51 = rcpps(_DAT_01ff1d40,auVar69);
            fVar60 = auVar51._0_4_;
            fVar65 = auVar51._4_4_;
            fVar67 = auVar51._8_4_;
            fVar76 = auVar51._12_4_;
            fVar60 = (1.0 - auVar69._0_4_ * fVar60) * fVar60 + fVar60;
            fVar65 = (1.0 - auVar69._4_4_ * fVar65) * fVar65 + fVar65;
            fVar67 = (1.0 - auVar69._8_4_ * fVar67) * fVar67 + fVar67;
            fVar76 = (1.0 - auVar69._12_4_ * fVar76) * fVar76 + fVar76;
            auVar51 = rcpps(auVar51,auVar71);
            fVar77 = auVar51._0_4_;
            fVar78 = auVar51._4_4_;
            fVar79 = auVar51._8_4_;
            fVar80 = auVar51._12_4_;
            fVar77 = (1.0 - auVar71._0_4_ * fVar77) * fVar77 + fVar77;
            fVar78 = (1.0 - auVar71._4_4_ * fVar78) * fVar78 + fVar78;
            fVar79 = (1.0 - auVar71._8_4_ * fVar79) * fVar79 + fVar79;
            fVar80 = (1.0 - auVar71._12_4_ * fVar80) * fVar80 + fVar80;
            auVar51 = rcpps(auVar51,auVar75);
            fVar81 = auVar51._0_4_;
            fVar82 = auVar51._4_4_;
            fVar73 = auVar51._8_4_;
            fVar74 = auVar51._12_4_;
            fVar81 = (1.0 - auVar75._0_4_ * fVar81) * fVar81 + fVar81;
            fVar82 = (1.0 - auVar75._4_4_ * fVar82) * fVar82 + fVar82;
            fVar73 = (1.0 - auVar75._8_4_ * fVar73) * fVar73 + fVar73;
            fVar74 = (1.0 - auVar75._12_4_ * fVar74) * fVar74 + fVar74;
            fVar57 = (*(float *)(uVar15 + 0x20) * fVar33 +
                     *(float *)(uVar15 + 0x50) * fVar34 +
                     *(float *)(uVar15 + 0x80) * fVar45 + *(float *)(uVar15 + 0xb0)) * -fVar60;
            fVar62 = (*(float *)(uVar15 + 0x24) * fVar33 +
                     *(float *)(uVar15 + 0x54) * fVar34 +
                     *(float *)(uVar15 + 0x84) * fVar45 + *(float *)(uVar15 + 0xb4)) * -fVar65;
            auVar39._0_8_ = CONCAT44(fVar62,fVar57);
            auVar39._8_4_ =
                 (*(float *)(uVar15 + 0x28) * fVar33 +
                 *(float *)(uVar15 + 0x58) * fVar34 +
                 *(float *)(uVar15 + 0x88) * fVar45 + *(float *)(uVar15 + 0xb8)) * -fVar67;
            auVar39._12_4_ =
                 (*(float *)(uVar15 + 0x2c) * fVar33 +
                 *(float *)(uVar15 + 0x5c) * fVar34 +
                 *(float *)(uVar15 + 0x8c) * fVar45 + *(float *)(uVar15 + 0xbc)) * -fVar76;
            auVar11._4_4_ = fVar61;
            auVar11._0_4_ = fVar61;
            auVar11._8_4_ = fVar61;
            auVar11._12_4_ = fVar61;
            fVar66 = (*(float *)(uVar15 + 0x30) * fVar33 +
                     *(float *)(uVar15 + 0x60) * fVar34 +
                     *(float *)(uVar15 + 0x90) * fVar45 + *(float *)(uVar15 + 0xc0)) * -fVar77;
            fVar56 = (*(float *)(uVar15 + 0x34) * fVar33 +
                     *(float *)(uVar15 + 100) * fVar34 +
                     *(float *)(uVar15 + 0x94) * fVar45 + *(float *)(uVar15 + 0xc4)) * -fVar78;
            auVar31._0_8_ = CONCAT44(fVar56,fVar66);
            auVar31._8_4_ =
                 (*(float *)(uVar15 + 0x38) * fVar33 +
                 *(float *)(uVar15 + 0x68) * fVar34 +
                 *(float *)(uVar15 + 0x98) * fVar45 + *(float *)(uVar15 + 200)) * -fVar79;
            auVar31._12_4_ =
                 (*(float *)(uVar15 + 0x3c) * fVar33 +
                 *(float *)(uVar15 + 0x6c) * fVar34 +
                 *(float *)(uVar15 + 0x9c) * fVar45 + *(float *)(uVar15 + 0xcc)) * -fVar80;
            fVar63 = (*(float *)(uVar15 + 0x40) * fVar33 +
                     *(float *)(uVar15 + 0x70) * fVar34 +
                     *(float *)(uVar15 + 0xa0) * fVar45 + *(float *)(uVar15 + 0xd0)) * -fVar81;
            fVar59 = (*(float *)(uVar15 + 0x44) * fVar33 +
                     *(float *)(uVar15 + 0x74) * fVar34 +
                     *(float *)(uVar15 + 0xa4) * fVar45 + *(float *)(uVar15 + 0xd4)) * -fVar82;
            auVar43._0_8_ = CONCAT44(fVar59,fVar63);
            auVar43._8_4_ =
                 (*(float *)(uVar15 + 0x48) * fVar33 +
                 *(float *)(uVar15 + 0x78) * fVar34 +
                 *(float *)(uVar15 + 0xa8) * fVar45 + *(float *)(uVar15 + 0xd8)) * -fVar73;
            auVar43._12_4_ =
                 (*(float *)(uVar15 + 0x4c) * fVar33 +
                 *(float *)(uVar15 + 0x7c) * fVar34 +
                 *(float *)(uVar15 + 0xac) * fVar45 + *(float *)(uVar15 + 0xdc)) * -fVar74;
            fVar60 = fVar60 + fVar57;
            fVar65 = fVar65 + fVar62;
            fVar67 = fVar67 + auVar39._8_4_;
            fVar76 = fVar76 + auVar39._12_4_;
            auVar70._0_4_ = fVar77 + fVar66;
            auVar70._4_4_ = fVar78 + fVar56;
            auVar70._8_4_ = fVar79 + auVar31._8_4_;
            auVar70._12_4_ = fVar80 + auVar31._12_4_;
            auVar72._0_4_ = fVar81 + fVar63;
            auVar72._4_4_ = fVar82 + fVar59;
            auVar72._8_4_ = fVar73 + auVar43._8_4_;
            auVar72._12_4_ = fVar74 + auVar43._12_4_;
            auVar48._8_4_ = auVar31._8_4_;
            auVar48._0_8_ = auVar31._0_8_;
            auVar48._12_4_ = auVar31._12_4_;
            auVar51 = minps(auVar48,auVar70);
            auVar52._8_4_ = auVar43._8_4_;
            auVar52._0_8_ = auVar43._0_8_;
            auVar52._12_4_ = auVar43._12_4_;
            auVar38 = minps(auVar52,auVar72);
            auVar49 = maxps(auVar51,auVar38);
            auVar53._8_4_ = auVar39._8_4_;
            auVar53._0_8_ = auVar39._0_8_;
            auVar53._12_4_ = auVar39._12_4_;
            auVar4._4_4_ = fVar65;
            auVar4._0_4_ = fVar60;
            auVar4._8_4_ = fVar67;
            auVar4._12_4_ = fVar76;
            auVar54 = minps(auVar53,auVar4);
            auVar5._4_4_ = fVar65;
            auVar5._0_4_ = fVar60;
            auVar5._8_4_ = fVar67;
            auVar5._12_4_ = fVar76;
            auVar38 = maxps(auVar39,auVar5);
            auVar51 = maxps(auVar31,auVar70);
            auVar42 = maxps(auVar43,auVar72);
            auVar51 = minps(auVar51,auVar42);
            auVar42 = maxps(auVar11,auVar54);
            auVar42 = maxps(auVar42,auVar49);
            auVar38 = minps(auVar68,auVar38);
            auVar51 = minps(auVar38,auVar51);
            auVar44._4_4_ = -(uint)(auVar42._4_4_ <= auVar51._4_4_);
            auVar44._0_4_ = -(uint)(auVar42._0_4_ <= auVar51._0_4_);
            auVar44._8_4_ = -(uint)(auVar42._8_4_ <= auVar51._8_4_);
            auVar44._12_4_ = -(uint)(auVar42._12_4_ <= auVar51._12_4_);
            uVar24 = movmskps((int)unaff_R15,auVar44);
            goto LAB_00194332;
          }
          bVar12 = false;
        }
        if (bVar12) {
          if (unaff_R15 == 0) {
            iVar17 = 4;
          }
          else {
            uVar15 = uVar16 & 0xfffffffffffffff0;
            lVar19 = 0;
            if (unaff_R15 != 0) {
              for (; (unaff_R15 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
              }
            }
            iVar17 = 0;
            uVar16 = *(ulong *)(uVar15 + lVar19 * 8);
            uVar18 = unaff_R15 - 1 & unaff_R15;
            if (uVar18 != 0) {
              pNVar20->ptr = uVar16;
              lVar19 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                }
              }
              uVar14 = uVar18 - 1;
              while( true ) {
                pNVar20 = pNVar20 + 1;
                uVar16 = *(ulong *)(uVar15 + lVar19 * 8);
                uVar14 = uVar14 & uVar18;
                if (uVar14 == 0) break;
                pNVar20->ptr = uVar16;
                lVar19 = 0;
                if (uVar14 != 0) {
                  for (; (uVar14 >> lVar19 & 1) == 0; lVar19 = lVar19 + 1) {
                  }
                }
                uVar18 = uVar14 - 1;
              }
            }
          }
        }
        else {
          iVar17 = 6;
        }
      } while (iVar17 == 0);
      if (iVar17 == 6) {
        cVar13 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 8))
                           (&pre,ray,context);
        iVar17 = 0;
        if (cVar13 != '\0') {
          ray->tfar = -INFINITY;
          iVar17 = 3;
        }
      }
    } while (iVar17 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }